

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitBitVector.h
# Opt level: O0

bool __thiscall BVUnitT<unsigned_long>::Dump(BVUnitT<unsigned_long> *this,BVIndex base,bool hasBits)

{
  BVUnitT<unsigned_long> local_28;
  BVUnitT<unsigned_long> _unit;
  byte local_15;
  BVIndex index;
  bool hasBits_local;
  BVIndex base_local;
  BVUnitT<unsigned_long> *this_local;
  
  local_28 = (BVUnitT<unsigned_long>)this->word;
  _unit.word._4_4_ = GetNextBit(&local_28);
  local_15 = hasBits;
  while (_unit.word._4_4_ != 0xffffffff) {
    Clear(&local_28,_unit.word._4_4_);
    if ((local_15 & 1) != 0) {
      Output::Print(L", ");
    }
    Output::Print(L"%u",(ulong)(_unit.word._4_4_ + base));
    local_15 = 1;
    _unit.word._4_4_ = GetNextBit(&local_28);
  }
  return (bool)(local_15 & 1);
}

Assistant:

bool Dump(BVIndex base = 0, bool hasBits = false) const
    {
        FOREACH_BITSET_IN_UNITBV(index, *this, BVUnitT)
        {
            if (hasBits)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%u"), index + base);
            hasBits = true;
        }
        NEXT_BITSET_IN_UNITBV;
        return hasBits;
    }